

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O3

void __thiscall aim_t::SetResult(aim_t *this,AimTarget *res,double frac,AActor *th,DAngle *pitch)

{
  double dVar1;
  
  if (frac < res->frac) {
    (res->super_FTranslatedLineTarget).linetarget = th;
    (res->pitch).Degrees = pitch->Degrees;
    dVar1 = c_atan2((th->__Pos).Y - (this->startpos).Y,(th->__Pos).X - (this->startpos).X);
    (res->super_FTranslatedLineTarget).angleFromSource.Degrees = dVar1 * 57.29577951308232;
    (res->super_FTranslatedLineTarget).unlinked = this->unlinked;
    res->frac = frac;
  }
  return;
}

Assistant:

void SetResult(AimTarget &res, double frac, AActor *th, DAngle pitch)
	{
		if (res.frac > frac)
		{
			res.linetarget = th;
			res.pitch = pitch;
			res.angleFromSource = (th->Pos() - startpos).Angle();
			res.unlinked = unlinked;
			res.frac = frac;
		}
	}